

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int iVar3;
  ostream *poVar4;
  TestPartResult *pTVar5;
  undefined8 *puVar6;
  string *value;
  TimeInMillis ms;
  int i;
  pointer pcVar7;
  char *pcVar8;
  internal *this;
  int iVar9;
  string location;
  string message;
  string kIndent;
  string kTestcase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [32];
  TestResult *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"testcase","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\n');
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\b');
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"name","");
  std::__cxx11::string::string
            ((string *)&local_d8,(test_info->name_)._M_dataplus._M_p,(allocator *)local_78);
  OutputJsonKey(stream,&local_98,&local_f8,&local_d8,&local_b8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  pbVar2 = (test_info->value_param_).ptr_;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"value_param","");
    pbVar2 = (test_info->value_param_).ptr_;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_d8,pcVar7,(allocator *)local_78);
    OutputJsonKey(stream,&local_98,&local_f8,&local_d8,&local_b8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  pbVar2 = (test_info->type_param_).ptr_;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"type_param","");
    pbVar2 = (test_info->type_param_).ptr_;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_d8,pcVar7,(allocator *)local_78);
    OutputJsonKey(stream,&local_98,&local_f8,&local_d8,&local_b8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"file","");
    std::__cxx11::string::string
              ((string *)&local_d8,(test_info->location_).file._M_dataplus._M_p,
               (allocator *)local_78);
    OutputJsonKey(stream,&local_98,&local_f8,&local_d8,&local_b8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"line","");
    OutputJsonKey(stream,&local_98,&local_f8,(test_info->location_).line,&local_b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\b');
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"status","");
    pcVar8 = "NOTRUN";
    if ((ulong)test_info->should_run_ != 0) {
      pcVar8 = "RUN";
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,pcVar8,pcVar8 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
    OutputJsonKey(stream,&local_98,&local_f8,&local_d8,&local_b8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&local_d8,(internal *)(test_info->result_).elapsed_time_,ms);
    OutputJsonKey(stream,&local_98,&local_f8,&local_d8,&local_b8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"classname","");
    std::__cxx11::string::string((string *)&local_d8,test_case_name,(allocator *)local_78);
    value = &local_d8;
    OutputJsonKey(stream,&local_98,&local_f8,value,&local_b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    local_58 = &test_info->result_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    TestPropertiesAsJson(&local_f8,local_58,&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(test_info->result_).test_part_results_.
                               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
      i = 0;
      iVar9 = 0;
      do {
        pTVar5 = TestResult::GetTestPartResult(local_58,i);
        iVar3 = (int)value;
        if (pTVar5->type_ != kSuccess) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
          if (iVar9 == 0) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (stream,local_b8._M_dataplus._M_p,local_b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"failures",8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
          }
          this = (internal *)(pTVar5->file_name_)._M_string_length;
          if (this != (internal *)0x0) {
            this = (internal *)(pTVar5->file_name_)._M_dataplus._M_p;
          }
          FormatCompilerIndependentFileLocation_abi_cxx11_
                    (&local_f8,this,(char *)(ulong)(uint)pTVar5->line_number_,iVar3);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,local_f8._M_dataplus._M_p,
                     local_f8._M_dataplus._M_p + local_f8._M_string_length);
          std::__cxx11::string::append((char *)local_50);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
          local_78._0_8_ = local_78 + 0x10;
          value = (string *)(puVar6 + 2);
          if ((string *)*puVar6 == value) {
            local_78._16_8_ = (value->_M_dataplus)._M_p;
            local_78._24_8_ = puVar6[3];
          }
          else {
            local_78._16_8_ = (value->_M_dataplus)._M_p;
            local_78._0_8_ = (string *)*puVar6;
          }
          local_78._8_8_ = puVar6[1];
          *puVar6 = value;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          EscapeJson(&local_d8,(string *)local_78);
          if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"failure\": \"",0x10);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"type\": \"\"\n",0xf);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          iVar9 = iVar9 + 1;
        }
        i = i + 1;
        iVar3 = (int)((ulong)((long)(test_info->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_info->result_).test_part_results_.
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      } while (SBORROW4(i,iVar3 * -0x49249249) != i + iVar3 * 0x49249249 < 0);
      if (0 < iVar9) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_f8,'\b');
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestcase, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestcase, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestcase, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}